

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::log<char_const(&)[42],char_const(&)[4],kj::String>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [42],
               char (*params_1) [4],String *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  char (*params_00) [4];
  String *params_01;
  long lVar3;
  ArrayPtr<kj::String> in_stack_ffffffffffffff88;
  undefined8 uStack_68;
  String local_60;
  String local_48;
  
  str<char_const(&)[42]>
            ((String *)&stack0xffffffffffffff88,(kj *)params,
             (char (*) [42])CONCAT44(in_register_00000014,severity));
  str<char_const(&)[4]>(&local_60,(kj *)params_1,params_00);
  str<kj::String&>(&local_48,(kj *)params_2,params_01);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff88,in_stack_ffffffffffffff88);
  lVar3 = 0x30;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff88 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff90 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff88 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff90 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&uStack_68 + lVar3))
                (*(undefined8 **)((long)&uStack_68 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}